

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O2

void __thiscall
wasm::
WalkerPass<wasm::PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>_>
::runOnFunction(WalkerPass<wasm::PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>_>
                *this,Module *module,Function *func)

{
  if ((this->super_Pass).runner != (PassRunner *)0x0) {
    Walker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>::
    walkFunctionInModule
              (&(this->
                super_PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>
                ).super_Walker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>
               ,func,module);
    return;
  }
  __assert_fail("getPassRunner()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/pass.h"
                ,0x214,
                "virtual void wasm::WalkerPass<wasm::PostWalker<wasm::InstrumentLocals>>::runOnFunction(Module *, Function *) [WalkerType = wasm::PostWalker<wasm::InstrumentLocals>]"
               );
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    assert(getPassRunner());
    WalkerType::walkFunctionInModule(func, module);
  }